

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::ElementsDecodeLockingScript::ConvertFromStruct
          (ElementsDecodeLockingScript *this,ElementsDecodeLockingScriptStruct *data)

{
  ElementsDecodeLockingScriptStruct *data_local;
  ElementsDecodeLockingScript *this_local;
  
  std::__cxx11::string::operator=((string *)&this->asm__,(string *)data);
  std::__cxx11::string::operator=((string *)&this->hex_,(string *)&data->hex);
  this->req_sigs_ = data->req_sigs;
  std::__cxx11::string::operator=((string *)&this->type_,(string *)&data->type);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->addresses_,&data->addresses);
  std::__cxx11::string::operator=((string *)&this->pegout_chain_,(string *)&data->pegout_chain);
  std::__cxx11::string::operator=((string *)&this->pegout_asm_,(string *)&data->pegout_asm);
  std::__cxx11::string::operator=((string *)&this->pegout_hex_,(string *)&data->pegout_hex);
  this->pegout_req_sigs_ = data->pegout_req_sigs;
  std::__cxx11::string::operator=((string *)&this->pegout_type_,(string *)&data->pegout_type);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->pegout_addresses_,&data->pegout_addresses);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void ElementsDecodeLockingScript::ConvertFromStruct(
    const ElementsDecodeLockingScriptStruct& data) {
  asm__ = data.asm_;
  hex_ = data.hex;
  req_sigs_ = data.req_sigs;
  type_ = data.type;
  addresses_.ConvertFromStruct(data.addresses);
  pegout_chain_ = data.pegout_chain;
  pegout_asm_ = data.pegout_asm;
  pegout_hex_ = data.pegout_hex;
  pegout_req_sigs_ = data.pegout_req_sigs;
  pegout_type_ = data.pegout_type;
  pegout_addresses_.ConvertFromStruct(data.pegout_addresses);
  ignore_items = data.ignore_items;
}